

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true> __thiscall
duckdb::RenameViewInfo::Deserialize(RenameViewInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_> this_00;
  pointer pRVar1;
  __uniq_ptr_impl<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>_> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>.
  super__Head_base<0UL,_duckdb::RenameViewInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>)
       operator_new(0x98);
  RenameViewInfo((RenameViewInfo *)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>
                 .super__Head_base<0UL,_duckdb::RenameViewInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>.
  super__Head_base<0UL,_duckdb::RenameViewInfo_*,_false>._M_head_impl =
       (tuple<duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>)
       (tuple<duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>
       .super__Head_base<0UL,_duckdb::RenameViewInfo_*,_false>._M_head_impl;
  pRVar1 = unique_ptr<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>,_true>::
           operator->((unique_ptr<duckdb::RenameViewInfo,_std::default_delete<duckdb::RenameViewInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"new_view_name",&pRVar1->new_view_name);
  (this->super_AlterViewInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::RenameViewInfo_*,_std::default_delete<duckdb::RenameViewInfo>_>
       .super__Head_base<0UL,_duckdb::RenameViewInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>_>)
         (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>_>)this;
}

Assistant:

unique_ptr<AlterViewInfo> RenameViewInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RenameViewInfo>(new RenameViewInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "new_view_name", result->new_view_name);
	return std::move(result);
}